

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O3

leb_Node leb_BoundingNode_Quad(leb_Heap *leb,float x,float y)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  leb_Node node;
  leb_Node node_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float local_5c;
  
  uVar4 = 0;
  uVar8 = 0;
  if ((((y <= 1.0) && (x <= 1.0)) && (0.0 <= x)) && (uVar4 = 0, 0.0 <= y)) {
    uVar8 = 0x100000000;
    fVar10 = x + y;
    uVar4 = (ulong)((1.0 < fVar10) + 2);
    uVar5 = uVar4 | 0x100000000;
    node.depth = 0;
    node.id = leb->maxDepth;
    uVar1 = leb__HeapRead((leb_Heap *)leb->buffer,node);
    if (uVar1 != 1) {
      fVar9 = (float)(~-(uint)(1.0 < fVar10) & (uint)x | (uint)(1.0 - x) & -(uint)(1.0 < fVar10));
      if (1.0 < fVar10) {
        y = 1.0 - y;
      }
      uVar8 = 1;
      uVar7 = 0x100000000;
      do {
        node_00.depth = 0;
        node_00.id = leb->maxDepth;
        uVar3 = (uint)uVar8;
        uVar2 = (uint)uVar4;
        uVar6 = uVar4;
        if (leb->maxDepth == uVar3) break;
        if (y <= fVar9) {
          if (uVar2 != uVar3) {
            uVar5 = (ulong)(uVar2 * 2) | uVar7 + 0x100000000 | 1;
          }
          local_5c = (1.0 - fVar9) - y;
        }
        else {
          if (uVar2 != uVar3) {
            uVar5 = (ulong)(uVar2 * 2) | uVar7 + 0x100000000;
          }
          local_5c = y - fVar9;
          fVar9 = 1.0 - fVar9;
        }
        uVar8 = uVar5 >> 0x20;
        fVar9 = fVar9 - y;
        uVar7 = uVar5 & 0xffffffff00000000;
        uVar4 = uVar5 & 0xffffffff;
        uVar1 = leb__HeapRead((leb_Heap *)leb->buffer,node_00);
        uVar6 = uVar5;
        y = local_5c;
      } while (uVar1 != 1);
      uVar8 = uVar8 << 0x20;
      uVar4 = uVar6 & 0xffffffff;
    }
  }
  return (leb_Node)(uVar4 | uVar8);
}

Assistant:

LEBDEF leb_Node leb_BoundingNode_Quad(const leb_Heap *leb, float x, float y)
{
    leb_Node node = {0u, 0};

    if (x >= 0.0f && y >= 0.0f && x <= 1.0f && y <= 1.0f) {
        if (x + y <= 1.0f) {
            node = {2u, 1};
        } else {
            node = {3u, 1};
            x = 1 - x;
            y = 1 - y;
        }

        while (!leb_IsLeafNode(leb, node) && !leb_IsCeilNode(leb, node)) {
            float s = x, t = y;

            if (s < t) {
                node = leb__LeftChildNode(node);
                x = (1.0f - s - t);
                y = (t - s);
            } else {
                node = leb__RightChildNode(node);
                x = (s - t);
                y = (1.0f - s - t);
            }
        }
    }

    return node;
}